

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_truetype.h
# Opt level: O3

stbtt_uint32 stbtt__find_table(stbtt_uint8 *data,stbtt_uint32 fontstart,char *tag)

{
  stbtt_uint32 sVar1;
  ushort uVar2;
  uint uVar3;
  ulong uVar4;
  
  uVar2 = swap_bytes(*(undefined2 *)(data + (ulong)fontstart + 4));
  if (uVar2 != 0) {
    uVar3 = fontstart + 0xc;
    uVar4 = (ulong)uVar2;
    do {
      if (((((uint)data[uVar3] == (int)*tag) && ((uint)data[(ulong)uVar3 + 1] == (int)tag[1])) &&
          ((uint)data[(ulong)uVar3 + 2] == (int)tag[2])) &&
         ((uint)data[(ulong)uVar3 + 3] == (int)tag[3])) {
        sVar1 = swap_bytes(*(undefined4 *)(data + (ulong)uVar3 + 8));
        return sVar1;
      }
      uVar3 = uVar3 + 0x10;
      uVar4 = uVar4 - 1;
    } while (uVar4 != 0);
  }
  return 0;
}

Assistant:

static stbtt_uint32 stbtt__find_table(stbtt_uint8 *data, stbtt_uint32 fontstart, const char *tag)
{
   stbtt_int32 num_tables = ttUSHORT(data+fontstart+4);
   stbtt_uint32 tabledir = fontstart + 12;
   stbtt_int32 i;
   for (i=0; i < num_tables; ++i) {
      stbtt_uint32 loc = tabledir + 16*i;
      if (stbtt_tag(data+loc+0, tag))
         return ttULONG(data+loc+8);
   }
   return 0;
}